

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# directive.cpp
# Opt level: O2

void __thiscall
ast::Dir_ascii::Dir_ascii
          (Dir_ascii *this,uint asciz,
          list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *sl,Location left)

{
  long lVar1;
  _List_node_base *p_Var2;
  uint8_t *local_50;
  uint local_48;
  
  (this->super_Directive).super_Statement.label._M_dataplus._M_p =
       (pointer)&(this->super_Directive).super_Statement.label.field_2;
  (this->super_Directive).super_Statement.label._M_string_length = 0;
  (this->super_Directive).super_Statement.label.field_2._M_local_buf[0] = '\0';
  (this->super_Directive).super_Statement.location.unit = left.unit;
  (this->super_Directive).super_Statement.location.line = left.line;
  (this->super_Directive).super_Statement.location.first_column = left.first_column;
  (this->super_Directive).super_Statement.location.last_column = left.last_column;
  *(undefined4 *)&(this->super_Directive).super_Statement.location.field_0x14 = left._20_4_;
  (this->super_Directive).super_Statement.size_in_memory = 0;
  (this->super_Directive).super_Statement._vptr_Statement = (_func_int **)&PTR__Dir_ascii_0013b840;
  this->string_list = sl;
  lVar1 = Sections::current_section;
  (this->super_Directive).super_Statement.section_index =
       *(uint *)(Sections::current_section + 0x20);
  (this->super_Directive).super_Statement.section_offset = *(uint *)(lVar1 + 0x30);
  p_Var2 = (_List_node_base *)sl;
  while (p_Var2 = (((_List_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)&p_Var2->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var2 != (_List_node_base *)sl) {
    std::__cxx11::string::string((string *)&local_50,(string *)(p_Var2 + 1));
    Sections::append_block(*(uint *)(Sections::current_section + 0x20),local_50,local_48);
    if (asciz != 0) {
      Sections::append8(*(uint *)(Sections::current_section + 0x20),'\0');
    }
    std::__cxx11::string::~string((string *)&local_50);
  }
  (this->super_Directive).super_Statement.size_in_memory =
       *(int *)(Sections::current_section + 0x30) -
       (this->super_Directive).super_Statement.section_offset;
  return;
}

Assistant:

Dir_ascii::Dir_ascii(unsigned asciz, list<string> *sl, Location left) :
	Directive {left}, string_list {sl}
{
	section_index = Sections::current_section->number;
	section_offset = Sections::current_section->content_size;
	for (auto s: *string_list) {
		Sections::append_block(Sections::current_section->number, (const uint8_t *)s.data(), s.size());
		if (asciz)
			Sections::append8(Sections::current_section->number, 0);
	}
	size_in_memory = Sections::current_section->content_size - section_offset;
}